

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

long proto2num(OperationConfig *config,long *val,char *str)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  char *__s;
  byte *pbVar4;
  int iVar5;
  char *pcVar6;
  sprotos *psVar7;
  long lVar8;
  
  lVar8 = 1;
  if ((str != (char *)0x0) && (__s = strdup(str), __s != (char *)0x0)) {
    pbVar4 = (byte *)strtok(__s,",");
    if (pbVar4 == (byte *)0x0) {
      lVar8 = 0;
    }
    else {
      lVar8 = 0;
      do {
        iVar3 = Curl_isalnum((uint)*pbVar4);
        iVar5 = 0;
        while (iVar3 == 0) {
          bVar1 = *pbVar4;
          if (bVar1 == 0x2b) {
            iVar5 = 0;
          }
          else {
            iVar5 = 2;
            if (bVar1 != 0x3d) {
              if (bVar1 != 0x2d) {
                lVar8 = 1;
                goto LAB_00119182;
              }
              iVar5 = 1;
            }
          }
          pbVar4 = pbVar4 + 1;
          iVar3 = Curl_isalnum((uint)*pbVar4);
        }
        psVar7 = proto2num::protos;
        pcVar6 = "all";
        do {
          psVar7 = psVar7 + 1;
          iVar3 = curl_strequal(pbVar4,pcVar6);
          if (iVar3 != 0) {
            uVar2 = psVar7[-1].bit;
            if (iVar5 == 0) {
              *val = *val | uVar2;
            }
            else if (iVar5 == 2) {
              *val = uVar2;
            }
            else {
              *val = *val & ~uVar2;
            }
            goto LAB_0011915b;
          }
          pcVar6 = psVar7->name;
        } while (pcVar6 != (char *)0x0);
        if (iVar5 == 2) {
          *val = 0;
        }
        warnf(config->global,"unrecognized protocol \'%s\'\n",pbVar4);
LAB_0011915b:
        pbVar4 = (byte *)strtok((char *)0x0,",");
      } while (pbVar4 != (byte *)0x0);
    }
LAB_00119182:
    free(__s);
  }
  return lVar8;
}

Assistant:

long proto2num(struct OperationConfig *config, long *val, const char *str)
{
  char *buffer;
  const char *sep = ",";
  char *token;

  static struct sprotos {
    const char *name;
    long bit;
  } const protos[] = {
    { "all", CURLPROTO_ALL },
    { "http", CURLPROTO_HTTP },
    { "https", CURLPROTO_HTTPS },
    { "ftp", CURLPROTO_FTP },
    { "ftps", CURLPROTO_FTPS },
    { "scp", CURLPROTO_SCP },
    { "sftp", CURLPROTO_SFTP },
    { "telnet", CURLPROTO_TELNET },
    { "ldap", CURLPROTO_LDAP },
    { "ldaps", CURLPROTO_LDAPS },
    { "dict", CURLPROTO_DICT },
    { "file", CURLPROTO_FILE },
    { "tftp", CURLPROTO_TFTP },
    { "imap", CURLPROTO_IMAP },
    { "imaps", CURLPROTO_IMAPS },
    { "pop3", CURLPROTO_POP3 },
    { "pop3s", CURLPROTO_POP3S },
    { "smtp", CURLPROTO_SMTP },
    { "smtps", CURLPROTO_SMTPS },
    { "rtsp", CURLPROTO_RTSP },
    { "gopher", CURLPROTO_GOPHER },
    { "smb", CURLPROTO_SMB },
    { "smbs", CURLPROTO_SMBS },
    { NULL, 0 }
  };

  if(!str)
    return 1;

  buffer = strdup(str); /* because strtok corrupts it */
  if(!buffer)
    return 1;

  /* Allow strtok() here since this isn't used threaded */
  /* !checksrc! disable BANNEDFUNC 2 */
  for(token = strtok(buffer, sep);
      token;
      token = strtok(NULL, sep)) {
    enum e_action { allow, deny, set } action = allow;

    struct sprotos const *pp;

    /* Process token modifiers */
    while(!ISALNUM(*token)) { /* may be NULL if token is all modifiers */
      switch (*token++) {
      case '=':
        action = set;
        break;
      case '-':
        action = deny;
        break;
      case '+':
        action = allow;
        break;
      default: /* Includes case of terminating NULL */
        Curl_safefree(buffer);
        return 1;
      }
    }

    for(pp = protos; pp->name; pp++) {
      if(curl_strequal(token, pp->name)) {
        switch(action) {
        case deny:
          *val &= ~(pp->bit);
          break;
        case allow:
          *val |= pp->bit;
          break;
        case set:
          *val = pp->bit;
          break;
        }
        break;
      }
    }

    if(!(pp->name)) { /* unknown protocol */
      /* If they have specified only this protocol, we say treat it as
         if no protocols are allowed */
      if(action == set)
        *val = 0;
      warnf(config->global, "unrecognized protocol '%s'\n", token);
    }
  }
  Curl_safefree(buffer);
  return 0;
}